

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtableview.cpp
# Opt level: O2

int __thiscall
QTableViewPrivate::nextActiveVisualColumn
          (QTableViewPrivate *this,int row,int columnToStart,int limit,
          SearchDirection searchDirection)

{
  bool bVar1;
  int lr;
  long in_FS_OFFSET;
  anon_class_8_1_8991fb9c local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  lr = logicalRow(this,row);
  local_38.this = this;
  if (searchDirection == Increasing) {
    while ((columnToStart < limit &&
           (bVar1 = nextActiveVisualColumn::anon_class_8_1_8991fb9c::operator()
                              (&local_38,lr,columnToStart), !bVar1))) {
      columnToStart = columnToStart + 1;
    }
  }
  else if (searchDirection == Decreasing) {
    while ((limit < columnToStart &&
           (bVar1 = nextActiveVisualColumn::anon_class_8_1_8991fb9c::operator()
                              (&local_38,lr,columnToStart), !bVar1))) {
      columnToStart = columnToStart + -1;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return columnToStart;
}

Assistant:

int QTableViewPrivate::nextActiveVisualColumn(int row, int columnToStart, int limit,
                                              SearchDirection searchDirection) const
{
    const int lr = logicalRow(row);
    int visualColumn = columnToStart;
    const auto isCellActive = [this](int lr, int vc)
    {
        const int lc = logicalColumn(vc);
        return !isColumnHidden(lc) && isCellEnabled(lr, lc);
    };
    switch (searchDirection) {
    case SearchDirection::Increasing:
        while (visualColumn < limit && !isCellActive(lr, visualColumn))
            ++visualColumn;
        break;
    case SearchDirection::Decreasing:
        while (visualColumn > limit && !isCellActive(lr, visualColumn))
            --visualColumn;
        break;
    }
    return visualColumn;
}